

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# domain.cpp
# Opt level: O2

void __thiscall Complete::Complete(Complete *this,BoolView *_x,bool *_v)

{
  Propagator::Propagator(&this->super_Propagator);
  (this->super_Propagator)._vptr_Propagator = (_func_int **)&PTR__Complete_001f2df0;
  (this->x).super_Var.super_Branching._vptr_Branching = (_func_int **)&PTR_finished_001efbb8;
  (this->x).v = _x->v;
  (this->x).s = _x->s;
  this->v = _v;
  (this->super_Propagator).priority = 0;
  BoolView::attach(&this->x,&this->super_Propagator,0,8);
  return;
}

Assistant:

Complete(BoolView _x, bool* _v) : x(std::move(_x)), v(_v) {
		priority = 0;
		x.attach(this, 0, EVENT_F);
	}